

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O1

void __thiscall cmConfigureLog::WriteValue(cmConfigureLog *this,string_view key,int value)

{
  ostream *this_00;
  uint uVar1;
  
  if (this->Indent != 0) {
    uVar1 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>,"  ",2);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->Indent);
  }
  this_00 = std::__ostream_insert<char,std::char_traits<char>>
                      (&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>,key._M_str
                       ,key._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,": ",2);
  std::ostream::operator<<(this_00,value);
  EndLine(this);
  return;
}

Assistant:

void cmConfigureLog::WriteValue(cm::string_view key, int value)
{
  this->BeginLine() << key << ": " << value;
  this->EndLine();
}